

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

void print_scope(D_Scope *st)

{
  D_Sym *pDVar1;
  D_SymHash *pDVar2;
  uint i;
  ulong uVar3;
  D_Sym **ppDVar4;
  
  do {
    printf("SCOPE %p: ",st);
    printf("  owned: %d, kind: %d, ",(ulong)(*(byte *)st >> 2 & 1),(ulong)(*(byte *)st & 3));
    if (st->ll != (D_Sym *)0x0) {
      puts("  LL");
    }
    ppDVar4 = &st->ll;
    if (st->hash == (D_SymHash *)0x0) {
LAB_00145561:
      while (pDVar1 = *ppDVar4, pDVar1 != (D_Sym *)0x0) {
        print_sym(pDVar1);
        ppDVar4 = &pDVar1->next;
      }
    }
    else {
      puts("  HASH");
      pDVar2 = st->hash;
      if (pDVar2 == (D_SymHash *)0x0) goto LAB_00145561;
      for (uVar3 = 0; uVar3 < (pDVar2->syms).n; uVar3 = uVar3 + 1) {
        pDVar1 = (pDVar2->syms).v[uVar3];
        if (pDVar1 != (D_Sym *)0x0) {
          print_sym(pDVar1);
          pDVar2 = st->hash;
        }
      }
    }
    puts("\n");
    if (st->dynamic != (D_Scope *)0x0) {
      print_scope(st->dynamic);
    }
    st = st->search;
    if (st == (D_Scope *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void print_scope(D_Scope *st) {
  printf("SCOPE %p: ", (void *)st);
  printf("  owned: %d, kind: %d, ", st->owned_by_user, st->kind);
  if (st->ll) printf("  LL\n");
  if (st->hash) printf("  HASH\n");
  if (st->hash) {
    uint i;
    for (i = 0; i < st->hash->syms.n; i++)
      if (st->hash->syms.v[i]) print_sym(st->hash->syms.v[i]);
  } else {
    D_Sym *ll = st->ll;
    while (ll) {
      print_sym(ll);
      ll = ll->next;
    }
  }
  printf("\n\n");
  if (st->dynamic) print_scope(st->dynamic);
  if (st->search) print_scope(st->search);
}